

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<char_const(&)[17],kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[32],kj::StringPtr&,char_const(&)[183],kj::Array<kj::StringTree>,char_const(&)[192]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [17],StringTree *params_1,
          char (*params_2) [7],StringPtr *params_3,char (*params_4) [32],StringPtr *params_5,
          char (*params_6) [183],Array<kj::StringTree> *params_7,char (*params_8) [192])

{
  char (*value) [17];
  StringTree *pSVar1;
  char (*value_00) [7];
  StringPtr *pSVar2;
  char (*value_01) [32];
  char (*value_02) [183];
  Array<kj::StringTree> *this_00;
  char (*value_03) [192];
  Array<kj::StringTree> *value_04;
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_e0;
  StringTree local_d0;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  Branch *local_38;
  char (*params_local_4) [32];
  StringPtr *params_local_3;
  char (*params_local_2) [7];
  StringTree *params_local_1;
  char (*params_local) [17];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = (Branch *)params_3;
  params_local_4 = (char (*) [32])params_2;
  params_local_3 = (StringPtr *)params_1;
  params_local_2 = (char (*) [7])params;
  params_local_1 = (StringTree *)this;
  params_local = (char (*) [17])__return_storage_ptr__;
  value = ::const((char (*) [17])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[17]>(value);
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value_00 = ::const((char (*) [7])params_local_3);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[7]>(value_00);
  pSVar2 = fwd<kj::StringPtr&>((StringPtr *)params_local_4);
  local_68 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar2);
  value_01 = ::const((char (*) [32])local_38);
  local_78 = _::toStringTreeOrCharSequence<char_const(&)[32]>(value_01);
  pSVar2 = fwd<kj::StringPtr&>((StringPtr *)params_4);
  local_88 = _::toStringTreeOrCharSequence<kj::StringPtr&>(pSVar2);
  value_02 = ::const((char (*) [183])params_5);
  local_98 = _::toStringTreeOrCharSequence<char_const(&)[183]>(value_02);
  this_00 = fwd<kj::Array<kj::StringTree>>((NoInfer<kj::Array<kj::StringTree>_> *)params_6);
  _::toStringTreeOrCharSequence<kj::Array<kj::StringTree>>(&local_d0,(_ *)this_00,value_04);
  value_03 = ::const((char (*) [192])params_7);
  local_e0 = _::toStringTreeOrCharSequence<char_const(&)[192]>(value_03);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,(StringTree *)&local_48,(ArrayPtr<const_char> *)pSVar1,
             (StringTree *)&local_58,&local_68,&local_78,&local_88,&local_98,
             (ArrayPtr<const_char> *)&local_d0,(StringTree *)&local_e0,
             (ArrayPtr<const_char> *)__return_storage_ptr___00);
  StringTree::~StringTree(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}